

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeFunctor * __thiscall icu_63::UnicodeSet::freeze(UnicodeSet *this)

{
  UBool UVar1;
  UChar32 *pUVar2;
  UnicodeSetStringSpan *pUVar3;
  BMPSet *this_00;
  UnicodeSet *in_RSI;
  BMPSet *local_70;
  UnicodeSetStringSpan *local_58;
  UnicodeSet *this_local;
  
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    if (this->buffer != (UChar32 *)0x0) {
      uprv_free_63(this->buffer);
      this->buffer = (UChar32 *)0x0;
    }
    if (this->len + 0x10 < this->capacity) {
      this->capacity = this->len + (uint)(this->len == 0);
      in_RSI = (UnicodeSet *)((long)this->capacity << 2);
      pUVar2 = (UChar32 *)uprv_realloc_63(this->list,(size_t)in_RSI);
      this->list = pUVar2;
      if (this->list == (UChar32 *)0x0) {
        setToBogus(this);
        return (UnicodeFunctor *)this;
      }
    }
    UVar1 = UVector::isEmpty(this->strings);
    if (UVar1 == '\0') {
      pUVar3 = (UnicodeSetStringSpan *)UMemory::operator_new((UMemory *)0x118,(size_t)in_RSI);
      local_58 = (UnicodeSetStringSpan *)0x0;
      if (pUVar3 != (UnicodeSetStringSpan *)0x0) {
        in_RSI = this;
        UnicodeSetStringSpan::UnicodeSetStringSpan(pUVar3,this,this->strings,0x3f);
        local_58 = pUVar3;
      }
      this->stringSpan = local_58;
      if ((this->stringSpan != (UnicodeSetStringSpan *)0x0) &&
         (UVar1 = UnicodeSetStringSpan::needsStringSpanUTF16(this->stringSpan), UVar1 == '\0')) {
        pUVar3 = this->stringSpan;
        if (pUVar3 != (UnicodeSetStringSpan *)0x0) {
          UnicodeSetStringSpan::~UnicodeSetStringSpan(pUVar3);
          UMemory::operator_delete((UMemory *)pUVar3,in_RSI);
        }
        this->stringSpan = (UnicodeSetStringSpan *)0x0;
      }
    }
    if (this->stringSpan == (UnicodeSetStringSpan *)0x0) {
      this_00 = (BMPSet *)UMemory::operator_new((UMemory *)0x368,(size_t)in_RSI);
      local_70 = (BMPSet *)0x0;
      if (this_00 != (BMPSet *)0x0) {
        BMPSet::BMPSet(this_00,this->list,this->len);
        local_70 = this_00;
      }
      this->bmpSet = local_70;
      if (this->bmpSet == (BMPSet *)0x0) {
        setToBogus(this);
      }
    }
  }
  return (UnicodeFunctor *)this;
}

Assistant:

UnicodeFunctor *UnicodeSet::freeze() {
    if(!isFrozen() && !isBogus()) {
        // Do most of what compact() does before freezing because
        // compact() will not work when the set is frozen.
        // Small modification: Don't shrink if the savings would be tiny (<=GROW_EXTRA).

        // Delete buffer first to defragment memory less.
        if (buffer != NULL) {
            uprv_free(buffer);
            buffer = NULL;
        }
        if (capacity > (len + GROW_EXTRA)) {
            // Make the capacity equal to len or 1.
            // We don't want to realloc of 0 size.
            capacity = len + (len == 0);
            list = (UChar32*) uprv_realloc(list, sizeof(UChar32) * capacity);
            if (list == NULL) { // Check for memory allocation error.
                setToBogus();
                return this;
            }
        }

        // Optimize contains() and span() and similar functions.
        if (!strings->isEmpty()) {
            stringSpan = new UnicodeSetStringSpan(*this, *strings, UnicodeSetStringSpan::ALL);
            if (stringSpan != NULL && !stringSpan->needsStringSpanUTF16()) {
                // All strings are irrelevant for span() etc. because
                // all of each string's code points are contained in this set.
                // Do not check needsStringSpanUTF8() because UTF-8 has at most as
                // many relevant strings as UTF-16.
                // (Thus needsStringSpanUTF8() implies needsStringSpanUTF16().)
                delete stringSpan;
                stringSpan = NULL;
            }
        }
        if (stringSpan == NULL) {
            // No span-relevant strings: Optimize for code point spans.
            bmpSet=new BMPSet(list, len);
            if (bmpSet == NULL) { // Check for memory allocation error.
                setToBogus();
            }
        }
    }
    return this;
}